

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

sexp sexp_type_slot_offset_op(sexp ctx,sexp self,sexp_sint_t n,sexp type,sexp slot)

{
  bool bVar1;
  sexp psVar2;
  sexp psVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  
  if ((((ulong)type & 3) != 0) || (type->tag != 1)) {
    psVar3 = sexp_type_exception(ctx,self,1,type);
    return psVar3;
  }
  psVar3 = (type->value).type.cpl;
  if ((((ulong)psVar3 & 3) != 0) || (psVar2 = psVar3, psVar3->tag != 10)) {
    psVar2 = (sexp)&type->value;
  }
  uVar5 = 0;
  if ((((ulong)psVar3 & 3) == 0) && (uVar5 = 0, psVar3->tag == 10)) {
    uVar5 = *(int *)&psVar3->value - 1;
  }
  if (-1 < (int)uVar5) {
    iVar6 = uVar5 + 1;
    uVar7 = (ulong)uVar5;
    do {
      piVar4 = *(int **)(*(long *)((long)&psVar2->value + uVar7 * 8 + 8) + 0x18);
      if (((ulong)piVar4 & 3) == 0) {
        iVar8 = 0;
        do {
          if (*piVar4 != 6) break;
          if (*(sexp *)(piVar4 + 2) == slot) {
            if (0 < (long)uVar7) {
              uVar7 = uVar7 & 0xffffffff;
              do {
                uVar7 = uVar7 - 1;
                psVar3 = sexp_length_op(ctx,(sexp)0x0,1,
                                        *(sexp *)(*(long *)((long)&psVar2->value +
                                                           (uVar7 & 0xffffffff) * 8 + 8) + 0x18));
                iVar8 = iVar8 + (int)((ulong)psVar3 >> 1);
                iVar6 = iVar6 + -1;
              } while (1 < iVar6);
            }
            return (sexp)((long)iVar8 * 2 + 1);
          }
          iVar8 = iVar8 + 1;
          piVar4 = *(int **)(piVar4 + 4);
        } while (((ulong)piVar4 & 3) == 0);
      }
      iVar6 = iVar6 + -1;
      bVar1 = 0 < (long)uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar1);
  }
  return (sexp)&DAT_0000003e;
}

Assistant:

sexp sexp_type_slot_offset_op (sexp ctx , sexp self, sexp_sint_t n, sexp type, sexp slot) {
  sexp cpl, slots, *v;
  int i, offset, len;
  sexp_assert_type(ctx, sexp_typep, SEXP_TYPE, type);
  cpl = sexp_type_cpl(type);
  if (sexp_vectorp(cpl)) {
    v = sexp_vector_data(cpl);
    len = sexp_vector_length(cpl);
  } else {
    v = &sexp_type_slots(type);
    len = 1;
  }
  len = sexp_vectorp(cpl) ? sexp_vector_length(cpl) : 1;
  for (i=len-1; i>=0; --i)
    for (slots=sexp_type_slots(v[i]), offset=0; sexp_pairp(slots); slots=sexp_cdr(slots), ++offset)
      if (sexp_car(slots) == slot) {
        while (--i>=0)
          offset += sexp_unbox_fixnum(sexp_length(ctx, sexp_type_slots(v[i])));
        return sexp_make_fixnum(offset);
      }
  return SEXP_FALSE;
}